

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bisstemeqcaselessblk(const_bstring b0,void *blk,int len)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  __int32_t **pp_Var5;
  ulong uVar6;
  ulong uVar7;
  
  iVar4 = -1;
  if (((b0 != (const_bstring)0x0) && (puVar3 = b0->data, iVar4 = -1, puVar3 != (uchar *)0x0)) &&
     (-1 < (b0->slen | len) && blk != (void *)0x0)) {
    if (b0->slen < len) {
LAB_00145659:
      iVar4 = 0;
    }
    else {
      iVar4 = 1;
      if (len != 0 && puVar3 != (uchar *)blk) {
        uVar6 = 0;
        uVar7 = (ulong)(uint)len;
        if (len < 1) {
          uVar7 = uVar6;
        }
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          bVar1 = puVar3[uVar6];
          bVar2 = *(byte *)((long)blk + uVar6);
          if ((bVar1 != bVar2) &&
             (pp_Var5 = __ctype_tolower_loc(), (*pp_Var5)[bVar1] != (*pp_Var5)[bVar2]))
          goto LAB_00145659;
        }
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int bisstemeqcaselessblk (const_bstring b0, const void * blk, int len) {
int i;

	if (bdata (b0) == NULL || b0->slen < 0 || NULL == blk || len < 0)
		return BSTR_ERR;
	if (b0->slen < len) return BSTR_OK;
	if (b0->data == (const unsigned char *) blk || len == 0) return 1;

	for (i = 0; i < len; i ++) {
		if (b0->data[i] != ((const unsigned char *) blk)[i]) {
			if (downcase (b0->data[i]) !=
			    downcase (((const unsigned char *) blk)[i])) return 0;
		}
	}
	return 1;
}